

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O2

pair<llvm::StringMapIterator<bool>,_bool> __thiscall
llvm::StringMap<bool,_llvm::MallocAllocator>::try_emplace<>
          (StringMap<bool,_llvm::MallocAllocator> *this,StringRef Key)

{
  int iVar1;
  uint uVar2;
  StringMapEntry<bool> *pSVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  pair<llvm::StringMapIterator<bool>,_bool> pVar5;
  StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_> local_30;
  
  uVar2 = StringMapImpl::LookupBucketFor((StringMapImpl *)this,Key);
  local_30.Ptr = (StringMapEntryBase **)(*(long *)this + (ulong)uVar2 * 8);
  if (*local_30.Ptr == (StringMapEntryBase *)0xfffffffffffffff8) {
    *(int *)(this + 0x10) = *(int *)(this + 0x10) + -1;
  }
  else if (*local_30.Ptr != (StringMapEntryBase *)0x0) {
    StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>::
    AdvancePastEmptyBuckets(&local_30);
    uVar4 = 0;
    goto LAB_00148a43;
  }
  pSVar3 = StringMapEntry<bool>::Create<llvm::MallocAllocator>(Key,(MallocAllocator *)(this + 0x18))
  ;
  *local_30.Ptr = &pSVar3->super_StringMapEntryBase;
  iVar1 = *(int *)(this + 0xc);
  *(int *)(this + 0xc) = iVar1 + 1;
  if (*(uint *)(this + 8) < (uint)(iVar1 + 1 + *(int *)(this + 0x10))) {
    __assert_fail("NumItems + NumTombstones <= NumBuckets",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringMap.h"
                  ,0x196,
                  "std::pair<iterator, bool> llvm::StringMap<bool>::try_emplace(StringRef, ArgsTy &&...) [ValueTy = bool, AllocatorTy = llvm::MallocAllocator, ArgsTy = <>]"
                 );
  }
  uVar2 = StringMapImpl::RehashTable((StringMapImpl *)this,uVar2);
  local_30.Ptr = (StringMapEntryBase **)((ulong)uVar2 * 8 + *(long *)this);
  StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>::
  AdvancePastEmptyBuckets(&local_30);
  uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_00148a43:
  pVar5._8_8_ = uVar4;
  pVar5.first.super_StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>.
  Ptr = (StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>)
        (StringMapIterBase<llvm::StringMapIterator<bool>,_llvm::StringMapEntry<bool>_>)local_30.Ptr;
  return pVar5;
}

Assistant:

std::pair<iterator, bool> try_emplace(StringRef Key, ArgsTy &&... Args) {
    unsigned BucketNo = LookupBucketFor(Key);
    StringMapEntryBase *&Bucket = TheTable[BucketNo];
    if (Bucket && Bucket != getTombstoneVal())
      return std::make_pair(iterator(TheTable + BucketNo, false),
                            false); // Already exists in map.

    if (Bucket == getTombstoneVal())
      --NumTombstones;
    Bucket = MapEntryTy::Create(Key, Allocator, std::forward<ArgsTy>(Args)...);
    ++NumItems;
    assert(NumItems + NumTombstones <= NumBuckets);

    BucketNo = RehashTable(BucketNo);
    return std::make_pair(iterator(TheTable + BucketNo, false), true);
  }